

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdinput.c
# Opt level: O2

int consume_markers(j_decompress_ptr cinfo)

{
  int iVar1;
  jpeg_input_controller *pjVar2;
  jpeg_error_mgr *pjVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int *piVar10;
  int iVar11;
  uint uVar12;
  
  pjVar2 = cinfo->inputctl;
  if (pjVar2->eoi_reached == 0) {
    do {
      while( true ) {
        iVar4 = (*cinfo->marker->read_markers)(cinfo);
        if (iVar4 != 1) {
          if (iVar4 != 2) {
            return iVar4;
          }
          pjVar2->eoi_reached = 1;
          if (*(int *)&pjVar2[1].consume_input != 0) {
            if (cinfo->marker->saw_SOF == 0) {
              return 2;
            }
            pjVar3 = cinfo->err;
            pjVar3->msg_code = 0x3d;
            (*pjVar3->error_exit)((j_common_ptr)cinfo);
            return 2;
          }
          if (cinfo->output_scan_number <= cinfo->input_scan_number) {
            return 2;
          }
          cinfo->output_scan_number = cinfo->input_scan_number;
          return 2;
        }
        if (*(int *)&pjVar2[1].consume_input == 0) break;
        if (*(int *)&pjVar2[1].consume_input == 1) {
          if ((0xffdc < cinfo->image_height) || (0xffdc < cinfo->image_width)) {
            *(undefined8 *)&cinfo->err->msg_code = 0xffdc0000002a;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          }
          iVar4 = cinfo->data_precision;
          if (iVar4 != 8) {
            pjVar3 = cinfo->err;
            pjVar3->msg_code = 0x10;
            (pjVar3->msg_parm).i[0] = iVar4;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          }
          iVar4 = cinfo->num_components;
          if (10 < iVar4) {
            pjVar3 = cinfo->err;
            pjVar3->msg_code = 0x1b;
            (pjVar3->msg_parm).i[0] = iVar4;
            (cinfo->err->msg_parm).i[1] = 10;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          }
          cinfo->max_h_samp_factor = 1;
          cinfo->max_v_samp_factor = 1;
          piVar10 = &cinfo->comp_info->v_samp_factor;
          uVar12 = 1;
          iVar8 = 1;
          iVar4 = 1;
          for (iVar9 = 0; iVar9 < cinfo->num_components; iVar9 = iVar9 + 1) {
            iVar1 = piVar10[-1];
            if ((iVar1 - 5U < 0xfffffffc) ||
               (iVar11 = *piVar10, iVar7 = iVar8, iVar11 - 5U < 0xfffffffc)) {
              pjVar3 = cinfo->err;
              pjVar3->msg_code = 0x13;
              (*pjVar3->error_exit)((j_common_ptr)cinfo);
              iVar7 = cinfo->max_h_samp_factor;
              iVar4 = cinfo->max_v_samp_factor;
              iVar1 = piVar10[-1];
              iVar11 = *piVar10;
            }
            iVar8 = iVar1;
            if (iVar1 < iVar7) {
              iVar8 = iVar7;
            }
            cinfo->max_h_samp_factor = iVar8;
            if (iVar11 < iVar4) {
              iVar11 = iVar4;
            }
            cinfo->max_v_samp_factor = iVar11;
            piVar10 = piVar10 + 0x18;
            iVar4 = iVar11;
          }
          if ((cinfo->is_baseline == 0) &&
             ((cinfo->progressive_mode == 0 || (cinfo->comps_in_scan == 0)))) {
            iVar4 = cinfo->Se;
            if (iVar4 == 0xff) {
              cinfo->block_size = 0x10;
              cinfo->natural_order = jpeg_natural_order;
              cinfo->lim_Se = 0x3f;
              uVar5 = 0x10;
            }
            else if (iVar4 == 3) {
              cinfo->block_size = 2;
              cinfo->natural_order = jpeg_natural_order2;
              cinfo->lim_Se = 3;
              uVar5 = 2;
            }
            else if (iVar4 == 8) {
              cinfo->block_size = 3;
              cinfo->natural_order = jpeg_natural_order3;
              cinfo->lim_Se = 8;
              uVar5 = 3;
            }
            else if (iVar4 == 0xf) {
              cinfo->block_size = 4;
              cinfo->natural_order = jpeg_natural_order4;
              cinfo->lim_Se = 0xf;
              uVar5 = 4;
            }
            else if (iVar4 == 0x18) {
              cinfo->block_size = 5;
              cinfo->natural_order = jpeg_natural_order5;
              cinfo->lim_Se = 0x18;
              uVar5 = 5;
            }
            else if (iVar4 == 0x23) {
              cinfo->block_size = 6;
              cinfo->natural_order = jpeg_natural_order6;
              cinfo->lim_Se = 0x23;
              uVar5 = 6;
            }
            else if (iVar4 == 0x30) {
              cinfo->block_size = 7;
              cinfo->natural_order = jpeg_natural_order7;
              cinfo->lim_Se = 0x30;
              uVar5 = 7;
            }
            else {
              if (iVar4 == 0x3f) goto LAB_00234bc3;
              if (iVar4 == 0x50) {
                cinfo->block_size = 9;
                cinfo->natural_order = jpeg_natural_order;
                cinfo->lim_Se = 0x3f;
                uVar5 = 9;
              }
              else if (iVar4 == 99) {
                cinfo->block_size = 10;
                cinfo->natural_order = jpeg_natural_order;
                cinfo->lim_Se = 0x3f;
                uVar5 = 10;
              }
              else if (iVar4 == 0x78) {
                cinfo->block_size = 0xb;
                cinfo->natural_order = jpeg_natural_order;
                cinfo->lim_Se = 0x3f;
                uVar5 = 0xb;
              }
              else if (iVar4 == 0x8f) {
                cinfo->block_size = 0xc;
                cinfo->natural_order = jpeg_natural_order;
                cinfo->lim_Se = 0x3f;
                uVar5 = 0xc;
              }
              else if (iVar4 == 0xa8) {
                cinfo->block_size = 0xd;
                cinfo->natural_order = jpeg_natural_order;
                cinfo->lim_Se = 0x3f;
                uVar5 = 0xd;
              }
              else if (iVar4 == 0xc3) {
                cinfo->block_size = 0xe;
                cinfo->natural_order = jpeg_natural_order;
                cinfo->lim_Se = 0x3f;
                uVar5 = 0xe;
              }
              else if (iVar4 == 0xe0) {
                cinfo->block_size = 0xf;
                cinfo->natural_order = jpeg_natural_order;
                cinfo->lim_Se = 0x3f;
                uVar5 = 0xf;
              }
              else if (iVar4 == 0) {
                cinfo->block_size = 1;
                cinfo->natural_order = jpeg_natural_order;
                cinfo->lim_Se = 0;
                uVar5 = uVar12;
              }
              else {
                pjVar3 = cinfo->err;
                pjVar3->msg_code = 0x11;
                (pjVar3->msg_parm).i[0] = cinfo->Ss;
                (cinfo->err->msg_parm).i[1] = cinfo->Se;
                (cinfo->err->msg_parm).i[2] = cinfo->Ah;
                (cinfo->err->msg_parm).i[3] = cinfo->Al;
                (*cinfo->err->error_exit)((j_common_ptr)cinfo);
                uVar5 = cinfo->block_size;
              }
            }
          }
          else {
LAB_00234bc3:
            cinfo->block_size = 8;
            cinfo->natural_order = jpeg_natural_order;
            cinfo->lim_Se = 0x3f;
            uVar5 = 8;
          }
          cinfo->min_DCT_h_scaled_size = uVar5;
          cinfo->min_DCT_v_scaled_size = uVar5;
          piVar10 = &cinfo->comp_info->h_samp_factor;
          for (iVar4 = 0; iVar4 < cinfo->num_components; iVar4 = iVar4 + 1) {
            iVar8 = cinfo->block_size;
            piVar10[7] = iVar8;
            piVar10[8] = iVar8;
            lVar6 = jdiv_round_up((long)*piVar10 * (ulong)cinfo->image_width,
                                  (long)cinfo->max_h_samp_factor * (long)iVar8);
            piVar10[5] = (JDIMENSION)lVar6;
            lVar6 = jdiv_round_up((long)piVar10[1] * (ulong)cinfo->image_height,
                                  (long)cinfo->block_size * (long)cinfo->max_v_samp_factor);
            piVar10[6] = (JDIMENSION)lVar6;
            lVar6 = jdiv_round_up((long)*piVar10 * (ulong)cinfo->image_width,
                                  (long)cinfo->max_h_samp_factor);
            piVar10[9] = (JDIMENSION)lVar6;
            lVar6 = jdiv_round_up((long)piVar10[1] * (ulong)cinfo->image_height,
                                  (long)cinfo->max_v_samp_factor);
            piVar10[10] = (JDIMENSION)lVar6;
            piVar10[0xb] = 1;
            *(JQUANT_TBL **)(piVar10 + 0x12) = (JQUANT_TBL *)0x0;
            piVar10 = piVar10 + 0x18;
          }
          lVar6 = jdiv_round_up((ulong)cinfo->image_height,
                                (long)cinfo->block_size * (long)cinfo->max_v_samp_factor);
          cinfo->total_iMCU_rows = (JDIMENSION)lVar6;
          iVar4 = cinfo->comps_in_scan;
          if (cinfo->num_components <= iVar4) {
            uVar12 = (uint)(cinfo->progressive_mode != 0);
          }
          cinfo->inputctl->has_multiple_scans = uVar12;
        }
        else {
          iVar4 = cinfo->comps_in_scan;
        }
        if (iVar4 != 0) {
          *(undefined4 *)&pjVar2[1].consume_input = 0;
          goto LAB_00235106;
        }
        *(undefined4 *)&pjVar2[1].consume_input = 2;
      }
      if (pjVar2->has_multiple_scans == 0) {
        pjVar3 = cinfo->err;
        pjVar3->msg_code = 0x24;
        (*pjVar3->error_exit)((j_common_ptr)cinfo);
      }
    } while (cinfo->comps_in_scan == 0);
    start_input_pass(cinfo);
LAB_00235106:
    iVar4 = 1;
  }
  else {
    iVar4 = 2;
  }
  return iVar4;
}

Assistant:

METHODDEF(int)
consume_markers (j_decompress_ptr cinfo)
{
  my_inputctl_ptr inputctl = (my_inputctl_ptr) cinfo->inputctl;
  int val;

  if (inputctl->pub.eoi_reached) /* After hitting EOI, read no further */
    return JPEG_REACHED_EOI;

  for (;;) {			/* Loop to pass pseudo SOS marker */
    val = (*cinfo->marker->read_markers) (cinfo);

    switch (val) {
    case JPEG_REACHED_SOS:	/* Found SOS */
      if (inputctl->inheaders) { /* 1st SOS */
	if (inputctl->inheaders == 1)
	  initial_setup(cinfo);
	if (cinfo->comps_in_scan == 0) { /* pseudo SOS marker */
	  inputctl->inheaders = 2;
	  break;
	}
	inputctl->inheaders = 0;
	/* Note: start_input_pass must be called by jdmaster.c
	 * before any more input can be consumed.  jdapimin.c is
	 * responsible for enforcing this sequencing.
	 */
      } else {			/* 2nd or later SOS marker */
	if (! inputctl->pub.has_multiple_scans)
	  ERREXIT(cinfo, JERR_EOI_EXPECTED); /* Oops, I wasn't expecting this! */
	if (cinfo->comps_in_scan == 0) /* unexpected pseudo SOS marker */
	  break;
	start_input_pass(cinfo);
      }
      return val;
    case JPEG_REACHED_EOI:	/* Found EOI */
      inputctl->pub.eoi_reached = TRUE;
      if (inputctl->inheaders) { /* Tables-only datastream, apparently */
	if (cinfo->marker->saw_SOF)
	  ERREXIT(cinfo, JERR_SOF_NO_SOS);
      } else {
	/* Prevent infinite loop in coef ctlr's decompress_data routine
	 * if user set output_scan_number larger than number of scans.
	 */
	if (cinfo->output_scan_number > cinfo->input_scan_number)
	  cinfo->output_scan_number = cinfo->input_scan_number;
      }
      return val;
    case JPEG_SUSPENDED:
      return val;
    default:
      return val;
    }
  }
}